

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feefrac.cpp
# Opt level: O2

partial_ordering CompareChunks(Span<const_FeeFrac> chunks0,Span<const_FeeFrac> chunks1)

{
  int iVar1;
  long lVar2;
  weak_ordering wVar3;
  byte bVar4;
  byte bVar5;
  uint dia;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  FeeFrac FVar10;
  FeeFrac FVar11;
  anon_class_24_3_20bf67a9 advance;
  anon_class_24_3_8dde4389 next_point;
  FeeFrac local_b0;
  FeeFrac local_a0;
  bool better_somewhere [2];
  FeeFrac accum [2];
  size_t next_index [2];
  array<Span<const_FeeFrac>,_2UL> local_58;
  long local_38;
  
  local_58._M_elems[1].m_size = chunks1.m_size;
  local_58._M_elems[1].m_data = chunks1.m_data;
  local_58._M_elems[0].m_size = chunks0.m_size;
  local_58._M_elems[0].m_data = chunks0.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  advance.chunk = &local_58;
  advance.accum = &accum;
  accum[0].fee = 0;
  accum[0].size = 0;
  accum[1].fee = 0;
  accum[1].size = 0;
  better_somewhere[0] = false;
  better_somewhere[1] = false;
  advance.next_index = &next_index;
  next_index[0] = 0;
  next_index[1] = 0;
  bVar5 = 0;
  next_point.chunk = advance.chunk;
  next_point.next_index = advance.next_index;
  next_point.accum = advance.accum;
  do {
    bVar7 = next_index[0] == local_58._M_elems[0].m_size;
    if (bVar7 && next_index[1] == local_58._M_elems[1].m_size) {
      bVar4 = -(bVar5 < better_somewhere[1]) | 1;
      if ((bool)bVar5 == better_somewhere[1]) {
        bVar4 = 0;
      }
      goto LAB_0061de08;
    }
    bVar8 = next_index[1] != local_58._M_elems[1].m_size;
    bVar9 = next_index[0] != local_58._M_elems[0].m_size;
    if (bVar9 && bVar8) {
      FVar10 = CompareChunks::anon_class_24_3_8dde4389::operator()(&next_point,0);
      FVar11 = CompareChunks::anon_class_24_3_8dde4389::operator()(&next_point,1);
      bVar7 = FVar11.size < FVar10.size;
    }
    dia = (uint)bVar7;
    FVar10 = CompareChunks::anon_class_24_3_8dde4389::operator()(&next_point,dia);
    bVar5 = bVar7 ^ 1;
    uVar6 = (ulong)bVar5;
    lVar2 = accum[bVar5].fee;
    iVar1 = accum[bVar5].size;
    local_a0.fee = FVar10.fee - lVar2;
    local_a0.size = FVar10.size - iVar1;
    if (bVar9 && bVar8) {
      FVar11 = CompareChunks::anon_class_24_3_8dde4389::operator()(&next_point,(uint)bVar5);
      local_b0.fee = FVar11.fee - lVar2;
      local_b0.size = FVar11.size - iVar1;
      wVar3 = FeeRateCompare(&local_a0,&local_b0);
      if (FVar11.size == FVar10.size) {
        CompareChunks::anon_class_24_3_20bf67a9::operator()(&advance,(uint)bVar5);
      }
    }
    else {
      local_b0.fee = 0;
      local_b0.size = 1;
      wVar3 = FeeRateCompare(&local_a0,&local_b0);
    }
    if (wVar3._M_value == -1) {
LAB_0061dda5:
      better_somewhere[uVar6] = true;
    }
    else if (wVar3._M_value == '\x01') {
      uVar6 = (ulong)dia;
      goto LAB_0061dda5;
    }
    CompareChunks::anon_class_24_3_20bf67a9::operator()(&advance,dia);
    bVar5 = better_somewhere[0];
  } while ((better_somewhere[0] != true) || (better_somewhere[1] != true));
  bVar4 = 2;
LAB_0061de08:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (partial_ordering)bVar4;
}

Assistant:

std::partial_ordering CompareChunks(Span<const FeeFrac> chunks0, Span<const FeeFrac> chunks1)
{
    /** Array to allow indexed access to input diagrams. */
    const std::array<Span<const FeeFrac>, 2> chunk = {chunks0, chunks1};
    /** How many elements we have processed in each input. */
    size_t next_index[2] = {0, 0};
    /** Accumulated fee/sizes in diagrams, up to next_index[i] - 1. */
    FeeFrac accum[2];
    /** Whether the corresponding input is strictly better than the other at least in one place. */
    bool better_somewhere[2] = {false, false};
    /** Get the first unprocessed point in diagram number dia. */
    const auto next_point = [&](int dia) { return chunk[dia][next_index[dia]] + accum[dia]; };
    /** Get the last processed point in diagram number dia. */
    const auto prev_point = [&](int dia) { return accum[dia]; };
    /** Move to the next point in diagram number dia. */
    const auto advance = [&](int dia) { accum[dia] += chunk[dia][next_index[dia]++]; };

    do {
        bool done_0 = next_index[0] == chunk[0].size();
        bool done_1 = next_index[1] == chunk[1].size();
        if (done_0 && done_1) break;

        // Determine which diagram has the first unprocessed point. If a single side is finished, use the
        // other one. Only up to one can be done due to check above.
        const int unproc_side = (done_0 || done_1) ? done_0 : next_point(0).size > next_point(1).size;

        // Let `P` be the next point on diagram unproc_side, and `A` and `B` the previous and next points
        // on the other diagram. We want to know if P lies above or below the line AB. To determine this, we
        // compute the slopes of line AB and of line AP, and compare them. These slopes are fee per size,
        // and can thus be expressed as FeeFracs.
        const FeeFrac& point_p = next_point(unproc_side);
        const FeeFrac& point_a = prev_point(!unproc_side);

        const auto slope_ap = point_p - point_a;
        Assume(slope_ap.size > 0);
        std::weak_ordering cmp = std::weak_ordering::equivalent;
        if (done_0 || done_1) {
            // If a single side has no points left, act as if AB has slope tail_feerate(of 0).
            Assume(!(done_0 && done_1));
            cmp = FeeRateCompare(slope_ap, FeeFrac(0, 1));
        } else {
            // If both sides have points left, compute B, and the slope of AB explicitly.
            const FeeFrac& point_b = next_point(!unproc_side);
            const auto slope_ab = point_b - point_a;
            Assume(slope_ab.size >= slope_ap.size);
            cmp = FeeRateCompare(slope_ap, slope_ab);

            // If B and P have the same size, B can be marked as processed (in addition to P, see
            // below), as we've already performed a comparison at this size.
            if (point_b.size == point_p.size) advance(!unproc_side);
        }
        // If P lies above AB, unproc_side is better in P. If P lies below AB, then !unproc_side is
        // better in P.
        if (std::is_gt(cmp)) better_somewhere[unproc_side] = true;
        if (std::is_lt(cmp)) better_somewhere[!unproc_side] = true;
        advance(unproc_side);

        // If both diagrams are better somewhere, they are incomparable.
        if (better_somewhere[0] && better_somewhere[1]) return std::partial_ordering::unordered;
    } while(true);

    // Otherwise compare the better_somewhere values.
    return better_somewhere[0] <=> better_somewhere[1];
}